

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_predictor.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue<false>
          (MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  int entry_id;
  int iVar1;
  int iVar2;
  CornerTable *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar8;
  const_reference pvVar9;
  ulong uVar10;
  Scalar_conflict SVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  size_type __n;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  reference rVar21;
  Vec2 pn_uv;
  int64_t cn_dot_pn;
  Self local_178;
  ulong local_158;
  VectorD<long,_2> local_150;
  Vec3 pn;
  Vec2 n_uv;
  Self local_118;
  Vec2 x_uv;
  Vec2 p_uv;
  Vec3 next_pos;
  VectorD<unsigned_long,_2> local_c0;
  VectorD<unsigned_long,_2> local_b0;
  VectorD<unsigned_long,_2> local_a0;
  Vec3 tip_pos;
  Vec3 x_pos;
  Vec3 cn;
  Vec3 prev_pos;
  
  __n = 0xffffffffffffffff;
  if (corner_id.value_ == 0xffffffff) {
    IVar8.value_ = 0xffffffff;
  }
  else {
    uVar7 = corner_id.value_ - 2;
    if ((corner_id.value_ + 1) % 3 != 0) {
      uVar7 = corner_id.value_ + 1;
    }
    uVar17 = (-(uint)(corner_id.value_ % 3 != 0) | 2) + corner_id.value_;
    pCVar3 = (this->mesh_data_).corner_table_;
    if (uVar7 == 0xffffffff) {
      IVar8.value_ = 0xffffffff;
    }
    else {
      IVar8.value_ = (pCVar3->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    if (uVar17 != 0xffffffff) {
      __n = (size_type)
            (int)(pCVar3->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
    }
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::at
                     ((this->mesh_data_).vertex_to_data_map_,(long)(int)IVar8.value_);
  iVar15 = *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::at((this->mesh_data_).vertex_to_data_map_,__n);
  entry_id = *pvVar9;
  if ((entry_id < data_id) && (iVar15 < data_id)) {
    iVar1 = data[(long)iVar15 * 2];
    n_uv.v_._M_elems[0] = (long)iVar1;
    iVar2 = data[iVar15 * 2 + 1];
    n_uv.v_._M_elems[1] = (long)iVar2;
    p_uv.v_._M_elems[0] = (long)data[(long)entry_id * 2];
    p_uv.v_._M_elems[1] = (long)data[entry_id * 2 + 1];
    if ((data[(long)entry_id * 2] == iVar1) && (data[entry_id * 2 + 1] == iVar2)) {
      this->predicted_value_[0] = iVar1;
      this->predicted_value_[1] = iVar2;
      return true;
    }
    GetPositionForEntryId(&tip_pos,this,data_id);
    GetPositionForEntryId(&next_pos,this,iVar15);
    GetPositionForEntryId(&prev_pos,this,entry_id);
    VectorD<long,_3>::operator-(&pn,&prev_pos,&next_pos);
    uVar10 = VectorD<long,_3>::SquaredNorm(&pn);
    if (uVar10 != 0) {
      VectorD<long,_3>::operator-(&cn,&tip_pos,&next_pos);
      SVar11 = VectorD<long,_3>::Dot(&pn,&cn);
      cn_dot_pn = SVar11;
      VectorD<long,_2>::operator-(&p_uv,&n_uv);
      uVar14 = -n_uv.v_._M_elems[0];
      if (0 < n_uv.v_._M_elems[0]) {
        uVar14 = n_uv.v_._M_elems[0];
      }
      uVar16 = -n_uv.v_._M_elems[1];
      if (0 < n_uv.v_._M_elems[1]) {
        uVar16 = n_uv.v_._M_elems[1];
      }
      if (uVar16 < uVar14) {
        uVar16 = uVar14;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar10;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar4,0) < uVar16) {
        return false;
      }
      uVar14 = -pn_uv.v_._M_elems[0];
      if (0 < pn_uv.v_._M_elems[0]) {
        uVar14 = pn_uv.v_._M_elems[0];
      }
      uVar16 = -pn_uv.v_._M_elems[1];
      if (0 < pn_uv.v_._M_elems[1]) {
        uVar16 = pn_uv.v_._M_elems[1];
      }
      if (uVar16 < uVar14) {
        uVar16 = uVar14;
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar16;
      if (SVar11 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar5,0)) {
        local_118.v_._M_elems[0] = uVar10;
        VectorD<long,_2>::operator*((VectorD<long,_2> *)&x_pos,(Scalar_conflict *)&n_uv);
        VectorD<long,_2>::operator*((VectorD<long,_2> *)&local_178,(Scalar_conflict *)&pn_uv);
        VectorD<long,_2>::operator+((VectorD<long,_2> *)&x_pos,(Self *)&local_178);
        uVar14 = -pn.v_._M_elems[0];
        if (0 < pn.v_._M_elems[0]) {
          uVar14 = pn.v_._M_elems[0];
        }
        uVar16 = -pn.v_._M_elems[1];
        if (0 < pn.v_._M_elems[1]) {
          uVar16 = pn.v_._M_elems[1];
        }
        uVar12 = -pn.v_._M_elems[2];
        if (0 < pn.v_._M_elems[2]) {
          uVar12 = pn.v_._M_elems[2];
        }
        if (uVar16 < uVar14) {
          uVar16 = uVar14;
        }
        if (uVar16 <= uVar12) {
          uVar16 = uVar12;
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar16;
        if (cn_dot_pn <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar6,0)) {
          VectorD<long,_3>::operator*(&local_118,&pn,&cn_dot_pn);
          local_150.v_._M_elems[0] = uVar10;
          VectorD<long,_3>::operator/(&local_178,&local_118,(Scalar_conflict *)&local_150);
          VectorD<long,_3>::operator+(&x_pos,&next_pos,&local_178);
          VectorD<long,_3>::operator-(&local_178,&tip_pos,&x_pos);
          SVar11 = VectorD<long,_3>::SquaredNorm(&local_178);
          local_178.v_._M_elems[1] = -pn_uv.v_._M_elems[0];
          local_178.v_._M_elems[0] = pn_uv.v_._M_elems[1];
          local_150.v_._M_elems[0] = IntSqrt(uVar10 * SVar11);
          VectorD<long,_2>::operator*((VectorD<long,_2> *)&local_118,(Scalar_conflict *)&local_178);
          local_178.v_._M_elems[0] = local_118.v_._M_elems[0];
          bVar19 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                   (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          bVar20 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0;
          bVar18 = bVar20 || bVar19;
          if (bVar20 || bVar19) {
            rVar21 = std::vector<bool,_std::allocator<bool>_>::back(&this->orientations_);
            uVar14 = *rVar21._M_p;
            std::_Bit_iterator_base::_M_bump_down
                      (&(this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base);
            if ((uVar14 & rVar21._M_mask) == 0) {
              VectorD<unsigned_long,2>::VectorD<long,2>(&local_b0,&x_uv);
              VectorD<unsigned_long,2>::VectorD<long,2>(&local_c0,(VectorD<long,_2> *)&local_178);
              VectorD<unsigned_long,_2>::operator-(&local_b0,&local_c0);
            }
            else {
              VectorD<unsigned_long,2>::VectorD<long,2>(&local_b0,&x_uv);
              VectorD<unsigned_long,2>::VectorD<long,2>(&local_c0,(VectorD<long,_2> *)&local_178);
              VectorD<unsigned_long,_2>::operator+(&local_b0,&local_c0);
            }
            VectorD<long,2>::VectorD<unsigned_long,2>(&local_150,&local_a0);
            local_158 = uVar10;
            VectorD<long,_2>::operator/
                      ((VectorD<long,_2> *)&local_118,(Scalar_conflict *)&local_150);
            *(ulong *)this->predicted_value_ =
                 CONCAT44((undefined4)local_118.v_._M_elems[1],(undefined4)local_118.v_._M_elems[0])
            ;
            return bVar18;
          }
          return bVar18;
        }
        return false;
      }
      return false;
    }
  }
  if (iVar15 < data_id) {
    iVar15 = iVar15 * 2;
  }
  else {
    if (data_id < 1) {
      this->predicted_value_[0] = 0;
      this->predicted_value_[1] = 0;
      return true;
    }
    iVar15 = data_id * 2 + -2;
  }
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    this->predicted_value_[lVar13] = data[iVar15 + lVar13];
  }
  return true;
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortablePredictor<
    DataTypeT, MeshDataT>::ComputePredictedValue(CornerIndex corner_id,
                                                 const DataTypeT *data,
                                                 int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id = mesh_data_.corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      mesh_data_.corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id = mesh_data_.corner_table()->Vertex(next_corner_id).value();
  prev_vert_id = mesh_data_.corner_table()->Vertex(prev_corner_id).value();

  next_data_id = mesh_data_.vertex_to_data_map()->at(next_vert_id);
  prev_data_id = mesh_data_.vertex_to_data_map()->at(prev_vert_id);

  typedef VectorD<int64_t, 2> Vec2;
  typedef VectorD<int64_t, 3> Vec3;
  typedef VectorD<uint64_t, 2> Vec2u;

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vec2 n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vec2 p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      predicted_value_[0] = p_uv[0];
      predicted_value_[1] = p_uv[1];
      return true;
    }

    // Get positions at all corners.
    const Vec3 tip_pos = GetPositionForEntryId(data_id);
    const Vec3 next_pos = GetPositionForEntryId(next_data_id);
    const Vec3 prev_pos = GetPositionForEntryId(prev_data_id);
    // We use the positions of the above triangle to predict the texture
    // coordinate on the tip corner C.
    // To convert the triangle into the UV coordinate system we first compute
    // position X on the vector |prev_pos - next_pos| that is the projection of
    // point C onto vector |prev_pos - next_pos|:
    //
    //              C
    //             /.  \
    //            / .     \
    //           /  .        \
    //          N---X----------P
    //
    // Where next_pos is point (N), prev_pos is point (P) and tip_pos is the
    // position of predicted coordinate (C).
    //
    const Vec3 pn = prev_pos - next_pos;
    const uint64_t pn_norm2_squared = pn.SquaredNorm();
    if (pn_norm2_squared != 0) {
      // Compute the projection of C onto PN by computing dot product of CN with
      // PN and normalizing it by length of PN. This gives us a factor |s| where
      // |s = PN.Dot(CN) / PN.SquaredNorm2()|. This factor can be used to
      // compute X in UV space |X_UV| as |X_UV = N_UV + s * PN_UV|.
      const Vec3 cn = tip_pos - next_pos;
      const int64_t cn_dot_pn = pn.Dot(cn);

      const Vec2 pn_uv = p_uv - n_uv;
      // Because we perform all computations with integers, we don't explicitly
      // compute the normalized factor |s|, but rather we perform all operations
      // over UV vectors in a non-normalized coordinate system scaled with a
      // scaling factor |pn_norm2_squared|:
      //
      //      x_uv = X_UV * PN.Norm2Squared()
      //
      const int64_t n_uv_absmax_element =
          std::max(std::abs(n_uv[0]), std::abs(n_uv[1]));
      if (n_uv_absmax_element >
          std::numeric_limits<int64_t>::max() / pn_norm2_squared) {
        // Return false if the below multiplication would overflow.
        return false;
      }
      const int64_t pn_uv_absmax_element =
          std::max(std::abs(pn_uv[0]), std::abs(pn_uv[1]));
      if (cn_dot_pn >
          std::numeric_limits<int64_t>::max() / pn_uv_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }
      const Vec2 x_uv = n_uv * pn_norm2_squared + (cn_dot_pn * pn_uv);
      const int64_t pn_absmax_element =
          std::max(std::max(std::abs(pn[0]), std::abs(pn[1])), std::abs(pn[2]));
      if (cn_dot_pn > std::numeric_limits<int64_t>::max() / pn_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }

      // Compute squared length of vector CX in position coordinate system:
      const Vec3 x_pos = next_pos + (cn_dot_pn * pn) / pn_norm2_squared;
      const uint64_t cx_norm2_squared = (tip_pos - x_pos).SquaredNorm();

      // Compute vector CX_UV in the uv space by rotating vector PN_UV by 90
      // degrees and scaling it with factor CX.Norm2() / PN.Norm2():
      //
      //     CX_UV = (CX.Norm2() / PN.Norm2()) * Rot(PN_UV)
      //
      // To preserve precision, we perform all operations in scaled space as
      // explained above, so we want the final vector to be:
      //
      //     cx_uv = CX_UV * PN.Norm2Squared()
      //
      // We can then rewrite the formula as:
      //
      //     cx_uv = CX.Norm2() * PN.Norm2() * Rot(PN_UV)
      //
      Vec2 cx_uv(pn_uv[1], -pn_uv[0]);  // Rotated PN_UV.
      // Compute CX.Norm2() * PN.Norm2()
      const uint64_t norm_squared =
          IntSqrt(cx_norm2_squared * pn_norm2_squared);
      // Final cx_uv in the scaled coordinate space.
      cx_uv = cx_uv * norm_squared;

      // Predicted uv coordinate is then computed by either adding or
      // subtracting CX_UV to/from X_UV.
      Vec2 predicted_uv;
      if (is_encoder_t) {
        // When encoding, compute both possible vectors and determine which one
        // results in a better prediction.
        // Both vectors need to be transformed back from the scaled space to
        // the real UV coordinate space.
        const Vec2 predicted_uv_0((x_uv + cx_uv) / pn_norm2_squared);
        const Vec2 predicted_uv_1((x_uv - cx_uv) / pn_norm2_squared);
        const Vec2 c_uv = GetTexCoordForEntryId(data_id, data);
        if ((c_uv - predicted_uv_0).SquaredNorm() <
            (c_uv - predicted_uv_1).SquaredNorm()) {
          predicted_uv = predicted_uv_0;
          orientations_.push_back(true);
        } else {
          predicted_uv = predicted_uv_1;
          orientations_.push_back(false);
        }
      } else {
        // When decoding the data, we already know which orientation to use.
        if (orientations_.empty()) {
          return false;
        }
        const bool orientation = orientations_.back();
        orientations_.pop_back();
        // Perform operations in unsigned type to avoid signed integer overflow.
        // Note that the result will be the same (for non-overflowing values).
        if (orientation) {
          predicted_uv = Vec2(Vec2u(x_uv) + Vec2u(cx_uv)) / pn_norm2_squared;
        } else {
          predicted_uv = Vec2(Vec2u(x_uv) - Vec2u(cx_uv)) / pn_norm2_squared;
        }
      }
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
      return true;
    }
  }
  // Else we don't have available textures on both corners or the position data
  // is invalid. For such cases we can't use positions for predicting the uv
  // value and we resort to delta coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * kNumComponents;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * kNumComponents;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * kNumComponents;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < kNumComponents; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < kNumComponents; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}